

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

int mbedtls_aes_crypt_cbc
              (mbedtls_aes_context *ctx,int mode,size_t length,uchar *iv,uchar *input,uchar *output)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  uchar temp [16];
  
  iVar3 = -0x22;
  if ((length & 0xf) == 0) {
    if (mode == 0) {
      if (length != 0) {
        do {
          uVar1 = *(undefined8 *)input;
          uVar2 = *(undefined8 *)(input + 8);
          mbedtls_aes_crypt_ecb(ctx,0,input,output);
          lVar4 = 0;
          do {
            output[lVar4] = output[lVar4] ^ iv[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 0x10);
          *(undefined8 *)iv = uVar1;
          *(undefined8 *)(iv + 8) = uVar2;
          input = input + 0x10;
          output = output + 0x10;
          length = length - 0x10;
        } while (length != 0);
      }
    }
    else if (length != 0) {
      do {
        lVar4 = 0;
        do {
          output[lVar4] = iv[lVar4] ^ input[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x10);
        mbedtls_aes_crypt_ecb(ctx,mode,output,output);
        uVar1 = *(undefined8 *)(output + 8);
        *(undefined8 *)iv = *(undefined8 *)output;
        *(undefined8 *)(iv + 8) = uVar1;
        input = input + 0x10;
        output = output + 0x10;
        length = length - 0x10;
      } while (length != 0);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mbedtls_aes_crypt_cbc( mbedtls_aes_context *ctx,
                    int mode,
                    size_t length,
                    unsigned char iv[16],
                    const unsigned char *input,
                    unsigned char *output )
{
    int i;
    unsigned char temp[16];

    if( length % 16 )
        return( MBEDTLS_ERR_AES_INVALID_INPUT_LENGTH );

#if defined(MBEDTLS_PADLOCK_C) && defined(MBEDTLS_HAVE_X86)
    if( aes_padlock_ace )
    {
        if( mbedtls_padlock_xcryptcbc( ctx, mode, length, iv, input, output ) == 0 )
            return( 0 );

        // If padlock data misaligned, we just fall back to
        // unaccelerated mode
        //
    }
#endif

    if( mode == MBEDTLS_AES_DECRYPT )
    {
        while( length > 0 )
        {
            memcpy( temp, input, 16 );
            mbedtls_aes_crypt_ecb( ctx, mode, input, output );

            for( i = 0; i < 16; i++ )
                output[i] = (unsigned char)( output[i] ^ iv[i] );

            memcpy( iv, temp, 16 );

            input  += 16;
            output += 16;
            length -= 16;
        }
    }
    else
    {
        while( length > 0 )
        {
            for( i = 0; i < 16; i++ )
                output[i] = (unsigned char)( input[i] ^ iv[i] );

            mbedtls_aes_crypt_ecb( ctx, mode, output, output );
            memcpy( iv, output, 16 );

            input  += 16;
            output += 16;
            length -= 16;
        }
    }

    return( 0 );
}